

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O1

void __thiscall
CEException::invalid_delimiter::invalid_delimiter
          (invalid_delimiter *this,string *origin,string *message)

{
  allocator local_41;
  string local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Invalid Delimiter",&local_41);
  CEExceptionHandler::CEExceptionHandler(&this->super_CEExceptionHandler,origin,message,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_41);
  *(undefined ***)&this->super_CEExceptionHandler = &PTR__CEExceptionHandler_00165888;
  return;
}

Assistant:

CEException::invalid_delimiter::invalid_delimiter(const std::string& origin,
                                                  const std::string& message) :
    CEExceptionHandler(origin, message, "Invalid Delimiter")
{}